

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O3

void __thiscall libtorrent::aux::torrent::dht_announce(torrent *this)

{
  _Atomic_word *p_Var1;
  byte bVar2;
  uint uVar3;
  _func_int **pp_Var4;
  ulong uVar5;
  element_type *peVar6;
  bool bVar7;
  int iVar8;
  undefined4 extraout_var;
  time_point tVar9;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  sha256_hash *this_00;
  announce_flags_t flags;
  weak_ptr<libtorrent::aux::torrent> self;
  announce_flags_t local_61;
  undefined1 local_60 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  weak_ptr<libtorrent::aux::torrent> *local_50;
  weak_ptr<libtorrent::aux::torrent> local_48;
  sha1_hash local_38;
  
  iVar8 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
            [0x49])();
  if (CONCAT44(extraout_var,iVar8) == 0) {
    (*(this->super_request_callback)._vptr_request_callback[7])(this,"DHT: no dht initialized");
    return;
  }
  bVar7 = should_announce_dht(this);
  pp_Var4 = (this->super_request_callback)._vptr_request_callback;
  if (!bVar7) {
    iVar8 = (*pp_Var4[6])(this);
    if ((char)iVar8 == '\0') {
      return;
    }
    if ((char)this->field_0x5cc < '\0') {
      iVar8 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                _vptr_session_logger[0x2e])();
      local_60 = (undefined1  [8])(CONCAT44(extraout_var_01,iVar8) + 0x438);
      local_58 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 ((ulong)local_58 & 0xffffffffffffff00);
      ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_60);
      local_58 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT71(local_58._1_7_,1);
      uVar3 = *(uint *)(CONCAT44(extraout_var_01,iVar8) + 0x428);
      ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_60);
      if ((uVar3 >> 0x17 & 1) == 0) {
        (*(this->super_request_callback)._vptr_request_callback[7])
                  (this,"DHT: i2p torrent (and mixed peers not allowed)");
      }
    }
    iVar8 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
              [0x45])();
    if ((char)iVar8 == '\0') {
      (*(this->super_request_callback)._vptr_request_callback[7])(this,"DHT: no listen sockets");
    }
    if ((0 < (((this->super_torrent_hot_members).m_torrent_file.
               super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             m_files).m_piece_length) && ((this->field_0x5c0 & 8) == 0)) {
      (*(this->super_request_callback)._vptr_request_callback[7])
                (this,"DHT: files not checked, skipping DHT announce");
    }
    if ((this->field_0x5e0 & 1) == 0) {
      (*(this->super_request_callback)._vptr_request_callback[7])
                (this,"DHT: queueing disabled DHT announce");
    }
    if (((this->super_torrent_hot_members).field_0x4b & 8) != 0) {
      (*(this->super_request_callback)._vptr_request_callback[7])
                (this,"DHT: torrent paused, no DHT announce");
    }
    if ((this->field_0x5cc & 0x20) == 0) {
      (*(this->super_request_callback)._vptr_request_callback[7])
                (this,"DHT: torrent has DHT disabled flag");
    }
    peVar6 = (this->super_torrent_hot_members).m_torrent_file.
             super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((0 < (peVar6->m_files).m_piece_length) && (((peVar6->m_flags).m_val & 2) != 0)) {
      (*(this->super_request_callback)._vptr_request_callback[7])
                (this,"DHT: private torrent, no DHT announce");
    }
    iVar8 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
              [0x2e])();
    local_60 = (undefined1  [8])(CONCAT44(extraout_var_02,iVar8) + 0x438);
    local_58 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               ((ulong)local_58 & 0xffffffffffffff00);
    ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_60);
    local_58 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT71(local_58._1_7_,true);
    bVar2 = *(byte *)(CONCAT44(extraout_var_02,iVar8) + 0x428);
    ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_60);
    if ((bVar2 & 0x10) == 0) {
      return;
    }
    bVar7 = tracker_list::any_verified(&this->m_trackers);
    if (!bVar7) {
      return;
    }
    (*(this->super_request_callback)._vptr_request_callback[7])
              (this,"DHT: only using DHT as fallback and there are working trackers");
    return;
  }
  (*pp_Var4[7])(this,"START DHT announce");
  tVar9 = time_now();
  (this->m_dht_start_time).__d.__r = (rep)tVar9.__d.__r;
  bVar7 = is_seed(this);
  if ((this->field_0x5e0 & 2) == 0) {
    local_61.m_val = bVar7;
    iVar8 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
              [0x2e])();
    local_60 = (undefined1  [8])(CONCAT44(extraout_var_00,iVar8) + 0x438);
    local_58 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               ((ulong)local_58 & 0xffffffffffffff00);
    ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_60);
    local_58 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT71(local_58._1_7_,1);
    uVar5 = *(ulong *)(CONCAT44(extraout_var_00,iVar8) + 0x428);
    ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_60);
    if ((uVar5 >> 0x21 & 1) != 0) {
      local_61.m_val = bVar7 | 2;
    }
  }
  else {
    local_61.m_val = bVar7 | 4;
  }
  ::std::__shared_ptr<libtorrent::aux::torrent,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<libtorrent::aux::torrent,void>
            ((__shared_ptr<libtorrent::aux::torrent,(__gnu_cxx::_Lock_policy)2> *)local_60,
             (__weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2> *)
             &this->super_enable_shared_from_this<libtorrent::aux::torrent>);
  local_48.super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_60;
  local_48.super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = local_58;
  if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_58->_M_weak_count = local_58->_M_weak_count + 1;
      UNLOCK();
      if (local_58 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_00315c0c;
    }
    else {
      local_58->_M_weak_count = local_58->_M_weak_count + 1;
    }
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
  }
LAB_00315c0c:
  peVar6 = (this->super_torrent_hot_members).m_torrent_file.
           super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_58 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&local_61;
  local_50 = &local_48;
  local_60 = (undefined1  [8])this;
  bVar7 = digest32<160L>::is_all_zeros(&(peVar6->m_info_hash).v1);
  if (!bVar7) {
    dht_announce::anon_class_24_3_bfd47678::operator()
              ((anon_class_24_3_bfd47678 *)local_60,&(peVar6->m_info_hash).v1,V1);
  }
  this_00 = &(peVar6->m_info_hash).v2;
  bVar7 = digest32<256L>::is_all_zeros(this_00);
  if (!bVar7) {
    local_38.m_number._M_elems[4] = (peVar6->m_info_hash).v2.m_number._M_elems[4];
    local_38.m_number._M_elems._0_8_ = *(undefined8 *)(this_00->m_number)._M_elems;
    local_38.m_number._M_elems._8_8_ =
         *(undefined8 *)((peVar6->m_info_hash).v2.m_number._M_elems + 2);
    dht_announce::anon_class_24_3_bfd47678::operator()
              ((anon_class_24_3_bfd47678 *)local_60,&local_38,V2);
  }
  if (local_48.super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &(local_48.super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_weak_count;
      iVar8 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar8 = (local_48.super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_weak_count;
      (local_48.super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_weak_count = iVar8 + -1;
    }
    if (iVar8 == 1) {
      (*(local_48.super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount
        ._M_pi)->_vptr__Sp_counted_base[3])();
    }
  }
  return;
}

Assistant:

void torrent::dht_announce()
	{
		TORRENT_ASSERT(is_single_thread());
		if (!m_ses.dht())
		{
#ifndef TORRENT_DISABLE_LOGGING
			debug_log("DHT: no dht initialized");
#endif
			return;
		}
		if (!should_announce_dht())
		{
#ifndef TORRENT_DISABLE_LOGGING
			if (should_log())
			{
#if TORRENT_USE_I2P
				if (is_i2p() && !settings().get_bool(settings_pack::allow_i2p_mixed))
					debug_log("DHT: i2p torrent (and mixed peers not allowed)");
#endif
				if (!m_ses.announce_dht())
					debug_log("DHT: no listen sockets");

				if (m_torrent_file->is_valid() && !m_files_checked)
					debug_log("DHT: files not checked, skipping DHT announce");

				if (!m_announce_to_dht)
					debug_log("DHT: queueing disabled DHT announce");

				if (m_paused)
					debug_log("DHT: torrent paused, no DHT announce");

				if (!m_enable_dht)
					debug_log("DHT: torrent has DHT disabled flag");

				if (m_torrent_file->is_valid() && m_torrent_file->priv())
					debug_log("DHT: private torrent, no DHT announce");

				if (settings().get_bool(settings_pack::use_dht_as_fallback)
					&& m_trackers.any_verified())
				{
					debug_log("DHT: only using DHT as fallback and there are working trackers");
				}
			}
#endif
			return;
		}

		TORRENT_ASSERT(!m_paused);

#ifndef TORRENT_DISABLE_LOGGING
		debug_log("START DHT announce");
		m_dht_start_time = aux::time_now();
#endif

		// if we're a seed, we tell the DHT for better scrape stats
		dht::announce_flags_t flags = is_seed() ? dht::announce::seed : dht::announce_flags_t{};

		// If this is an SSL torrent the announce needs to specify an SSL
		// listen port. DHT nodes only operate on non-SSL ports so SSL
		// torrents cannot use implied_port.
		// if we allow incoming uTP connections, set the implied_port
		// argument in the announce, this will make the DHT node use
		// our source port in the packet as our listen port, which is
		// likely more accurate when behind a NAT
		if (is_ssl_torrent())
		{
			flags |= dht::announce::ssl_torrent;
		}
		else if (settings().get_bool(settings_pack::enable_incoming_utp))
		{
			flags |= dht::announce::implied_port;
		}

		std::weak_ptr<torrent> self(shared_from_this());
		m_torrent_file->info_hashes().for_each([&](sha1_hash const& ih, protocol_version v)
		{
			m_ses.dht()->announce(ih, 0, flags
				, std::bind(&torrent::on_dht_announce_response_disp, self, v, _1));
		});
	}